

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaB_pcall(lua_State *L)

{
  StkId pTVar1;
  int iVar2;
  int in_ECX;
  
  luaL_checkany(L,1);
  iVar2 = lua_pcall(L,(int)((ulong)((long)L->top - (long)L->base) >> 4) + -1,-1,in_ECX);
  pTVar1 = L->top;
  *(uint *)&pTVar1->value = (uint)(iVar2 == 0);
  pTVar1->tt = 1;
  L->top = L->top + 1;
  lua_insert(L,1);
  return (int)((ulong)((long)L->top - (long)L->base) >> 4);
}

Assistant:

static int luaB_pcall(lua_State*L){
int status;
luaL_checkany(L,1);
status=lua_pcall(L,lua_gettop(L)-1,(-1),0);
lua_pushboolean(L,(status==0));
lua_insert(L,1);
return lua_gettop(L);
}